

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

int Curl_resolv_getsock(connectdata *conn,curl_socket_t *socks)

{
  void *pvVar1;
  Curl_easy *data;
  undefined1 (*pauVar2) [12];
  ulong uVar3;
  ulong milli;
  int iVar4;
  curltime cVar5;
  curltime newer;
  
  if (((conn->data->set).field_0x916 & 0x80) != 0) {
    return 0;
  }
  pvVar1 = (conn->async).os_specific;
  if (pvVar1 == (void *)0x0) {
    data = conn->data;
    pauVar2 = (undefined1 (*) [12])(data->state).resolver;
    cVar5 = Curl_now();
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar5._0_12_,0);
    newer.tv_usec = SUB124(cVar5._0_12_,8);
    cVar5._12_4_ = 0;
    cVar5._0_12_ = *pauVar2;
    uVar3 = Curl_timediff(newer,cVar5);
    iVar4 = 0;
    if ((long)uVar3 < 3) {
      milli = 0;
    }
    else if (uVar3 < 0x33) {
      milli = (ulong)(((uint)uVar3 & 0xff) / 3);
    }
    else {
      milli = 200;
      if (uVar3 < 0xfb) {
        milli = 0x32;
      }
    }
    Curl_expire(data,milli,EXPIRE_ASYNC_NAME);
  }
  else {
    *socks = *(curl_socket_t *)((long)pvVar1 + 0x40);
    *(connectdata **)((long)pvVar1 + 0x38) = conn;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Curl_resolv_getsock(struct connectdata *conn,
                        curl_socket_t *socks)
{
#ifdef CURLRES_ASYNCH
  if(conn->data->set.doh)
    /* nothing to wait for during DOH resolve, those handles have their own
       sockets */
    return GETSOCK_BLANK;
  return Curl_resolver_getsock(conn, socks);
#else
  (void)conn;
  (void)socks;
  return GETSOCK_BLANK;
#endif
}